

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Base.cpp
# Opt level: O2

string * __thiscall mbc::Val::ValBase::str_abi_cxx11_(string *__return_storage_ptr__,ValBase *this)

{
  if (*this->is_vaild_ == true) {
    (*this->_vptr_ValBase[3])(__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this->invaild_waring_);
  }
  return __return_storage_ptr__;
}

Assistant:

const string ValBase::str() const {
    if (*is_vaild_) {
        return str_();
    } else {
        return *invaild_waring_;
    }
}